

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

void __thiscall
CoreML::Specification::BiDirectionalLSTMLayerParams::InternalSwap
          (BiDirectionalLSTMLayerParams *this,BiDirectionalLSTMLayerParams *other)

{
  int iVar1;
  LSTMParams *pLVar2;
  uint64 uVar3;
  
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activationsforwardlstm_).super_RepeatedPtrFieldBase,
             &(other->activationsforwardlstm_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->activationsbackwardlstm_).super_RepeatedPtrFieldBase,
             &(other->activationsbackwardlstm_).super_RepeatedPtrFieldBase);
  google::protobuf::internal::RepeatedPtrFieldBase::InternalSwap
            (&(this->weightparams_).super_RepeatedPtrFieldBase,
             &(other->weightparams_).super_RepeatedPtrFieldBase);
  pLVar2 = this->params_;
  this->params_ = other->params_;
  other->params_ = pLVar2;
  uVar3 = this->inputvectorsize_;
  this->inputvectorsize_ = other->inputvectorsize_;
  other->inputvectorsize_ = uVar3;
  uVar3 = this->outputvectorsize_;
  this->outputvectorsize_ = other->outputvectorsize_;
  other->outputvectorsize_ = uVar3;
  iVar1 = this->_cached_size_;
  this->_cached_size_ = other->_cached_size_;
  other->_cached_size_ = iVar1;
  return;
}

Assistant:

void BiDirectionalLSTMLayerParams::InternalSwap(BiDirectionalLSTMLayerParams* other) {
  activationsforwardlstm_.InternalSwap(&other->activationsforwardlstm_);
  activationsbackwardlstm_.InternalSwap(&other->activationsbackwardlstm_);
  weightparams_.InternalSwap(&other->weightparams_);
  std::swap(params_, other->params_);
  std::swap(inputvectorsize_, other->inputvectorsize_);
  std::swap(outputvectorsize_, other->outputvectorsize_);
  std::swap(_cached_size_, other->_cached_size_);
}